

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double * circular_normal_sample(double *a,double b,int *seed)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pdVar3 = (double *)operator_new__(0x10);
  iVar4 = (*seed / 0x1f31d) * -0x7fffffff + *seed * 0x41a7;
  iVar5 = iVar4 + 0x7fffffff;
  if (-1 < iVar4) {
    iVar5 = iVar4;
  }
  iVar2 = (iVar5 / 0x1f31d) * -0x7fffffff + iVar5 * 0x41a7;
  iVar4 = iVar2 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar4 = iVar2;
  }
  *seed = iVar4;
  dVar6 = log((double)iVar5 * 4.656612875e-10);
  dVar6 = dVar6 * -2.0;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar1 = *a;
  dVar7 = (double)iVar4 * 4.656612875e-10 * 6.283185307179586;
  dVar8 = cos(dVar7);
  *pdVar3 = dVar8 * dVar6 * b + dVar1;
  dVar1 = a[1];
  dVar7 = sin(dVar7);
  pdVar3[1] = dVar7 * dVar6 * b + dVar1;
  return pdVar3;
}

Assistant:

double *circular_normal_sample ( double a[2], double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    CIRCULAR_NORMAL_SAMPLE samples the Circular Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 January 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A[2], a parameter of the PDF, the mean value.
//
//    Input, double B, a parameter of the PDF, the standard deviation.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double CIRCULAR_NORMAL_SAMPLE[2], a sample of the PDF.
//
{
  const double r8_pi = 3.14159265358979323;
  double r;
  double v1;
  double v2;
  double *x;

  x = new double[2];

  v1 = r8_uniform_01 ( seed );
  v2 = r8_uniform_01 ( seed );

  r = sqrt ( - 2.0 * log ( v1 ) );

  x[0] = a[0] + b * r * cos ( 2.0 * r8_pi * v2 );
  x[1] = a[1] + b * r * sin ( 2.0 * r8_pi * v2 );

  return x;
}